

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O3

void __thiscall
iutest::detail::ElementsAreMatcher<char,_char,_char,_char,_char>::~ElementsAreMatcher
          (ElementsAreMatcher<char,_char,_char,_char,_char> *this)

{
  operator_delete(this,0x10);
  return;
}

Assistant:

class ElementsAreMatcher IUTEST_CXX_FINAL : public ElementsAreMatcherBase
{
public:
    explicit ElementsAreMatcher(T... t) : m_matchers(t...) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        return Check(m_matchers, actual);
    }
    ::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        return ElementsAreMatcherBase::WhichIs<0>(m_matchers);
    }

private:
    tuples::tuple<T...> m_matchers;
}